

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int pcap_setfilter_linux_common(pcap_t *handle,bpf_program *filter,int is_mmapped)

{
  bool bVar1;
  FILE *__stream;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int local_48;
  int err;
  int can_filter_in_kernel;
  sock_fprog fcode;
  pcap_linux *handlep;
  int is_mmapped_local;
  bpf_program *filter_local;
  pcap_t *handle_local;
  
  local_48 = 0;
  if (handle == (pcap_t *)0x0) {
    return -1;
  }
  if (filter != (bpf_program *)0x0) {
    fcode.filter = (sock_filter *)handle->priv;
    iVar2 = install_bpf_program(handle,filter);
    if (iVar2 < 0) {
      return -1;
    }
    fcode.filter[5].code = 1;
    fcode.filter[5].jt = '\0';
    fcode.filter[5].jf = '\0';
    if ((handle->fcode).bf_len < 0x10000) {
      iVar2 = fix_program(handle,(sock_fprog *)&err,is_mmapped);
      if (iVar2 == -1) {
        return -1;
      }
      if (iVar2 == 0) {
        bVar1 = false;
      }
      else {
        if (iVar2 != 1) {
          return -1;
        }
        bVar1 = true;
      }
    }
    else {
      fprintf(_stderr,"Warning: Filter too complex for kernel\n");
      err._0_2_ = 0;
      fcode.len = 0;
      fcode._2_6_ = 0;
      bVar1 = false;
    }
    if (bVar1) {
      local_48 = set_kernel_filter(handle,(sock_fprog *)&err);
      if (local_48 == 0) {
        fcode.filter[5].code = 0;
        fcode.filter[5].jt = '\0';
        fcode.filter[5].jf = '\0';
      }
      else if (((local_48 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x5c)) &&
              (piVar3 = __errno_location(), __stream = _stderr, *piVar3 != 0x5f)) {
        piVar3 = __errno_location();
        pcVar4 = pcap_strerror(*piVar3);
        fprintf(__stream,"Warning: Kernel filter failed: %s\n",pcVar4);
      }
    }
    iVar2._0_2_ = fcode.filter[5].code;
    iVar2._2_1_ = fcode.filter[5].jt;
    iVar2._3_1_ = fcode.filter[5].jf;
    if ((iVar2 != 0) && (iVar2 = reset_kernel_filter(handle), iVar2 == -1)) {
      piVar3 = __errno_location();
      pcVar4 = pcap_strerror(*piVar3);
      snprintf(handle->errbuf,0x100,"can\'t remove kernel filter: %s",pcVar4);
      local_48 = -2;
    }
    if (fcode._0_8_ != 0) {
      free((void *)fcode._0_8_);
    }
    if (local_48 == -2) {
      handle_local._4_4_ = -1;
    }
    else {
      handle_local._4_4_ = 0;
    }
    return handle_local._4_4_;
  }
  strncpy(handle->errbuf,"setfilter: No filter specified",0x100);
  handle->errbuf[0xff] = '\0';
  return -1;
}

Assistant:

static int
pcap_setfilter_linux_common(pcap_t *handle, struct bpf_program *filter,
    int is_mmapped)
{
	struct pcap_linux *handlep;
#ifdef SO_ATTACH_FILTER
	struct sock_fprog	fcode;
	int			can_filter_in_kernel;
	int			err = 0;
#endif

	if (!handle)
		return -1;
	if (!filter) {
	        strlcpy(handle->errbuf, "setfilter: No filter specified",
			PCAP_ERRBUF_SIZE);
		return -1;
	}

	handlep = handle->priv;

	/* Make our private copy of the filter */

	if (install_bpf_program(handle, filter) < 0)
		/* install_bpf_program() filled in errbuf */
		return -1;

	/*
	 * Run user level packet filter by default. Will be overriden if
	 * installing a kernel filter succeeds.
	 */
	handlep->filter_in_userland = 1;

	/* Install kernel level filter if possible */

#ifdef SO_ATTACH_FILTER
#ifdef USHRT_MAX
	if (handle->fcode.bf_len > USHRT_MAX) {
		/*
		 * fcode.len is an unsigned short for current kernel.
		 * I have yet to see BPF-Code with that much
		 * instructions but still it is possible. So for the
		 * sake of correctness I added this check.
		 */
		fprintf(stderr, "Warning: Filter too complex for kernel\n");
		fcode.len = 0;
		fcode.filter = NULL;
		can_filter_in_kernel = 0;
	} else
#endif /* USHRT_MAX */
	{
		/*
		 * Oh joy, the Linux kernel uses struct sock_fprog instead
		 * of struct bpf_program and of course the length field is
		 * of different size. Pointed out by Sebastian
		 *
		 * Oh, and we also need to fix it up so that all "ret"
		 * instructions with non-zero operands have MAXIMUM_SNAPLEN
		 * as the operand if we're not capturing in memory-mapped
		 * mode, and so that, if we're in cooked mode, all memory-
		 * reference instructions use special magic offsets in
		 * references to the link-layer header and assume that the
		 * link-layer payload begins at 0; "fix_program()" will do
		 * that.
		 */
		switch (fix_program(handle, &fcode, is_mmapped)) {

		case -1:
		default:
			/*
			 * Fatal error; just quit.
			 * (The "default" case shouldn't happen; we
			 * return -1 for that reason.)
			 */
			return -1;

		case 0:
			/*
			 * The program performed checks that we can't make
			 * work in the kernel.
			 */
			can_filter_in_kernel = 0;
			break;

		case 1:
			/*
			 * We have a filter that'll work in the kernel.
			 */
			can_filter_in_kernel = 1;
			break;
		}
	}

	/*
	 * NOTE: at this point, we've set both the "len" and "filter"
	 * fields of "fcode".  As of the 2.6.32.4 kernel, at least,
	 * those are the only members of the "sock_fprog" structure,
	 * so we initialize every member of that structure.
	 *
	 * If there is anything in "fcode" that is not initialized,
	 * it is either a field added in a later kernel, or it's
	 * padding.
	 *
	 * If a new field is added, this code needs to be updated
	 * to set it correctly.
	 *
	 * If there are no other fields, then:
	 *
	 *	if the Linux kernel looks at the padding, it's
	 *	buggy;
	 *
	 *	if the Linux kernel doesn't look at the padding,
	 *	then if some tool complains that we're passing
	 *	uninitialized data to the kernel, then the tool
	 *	is buggy and needs to understand that it's just
	 *	padding.
	 */
	if (can_filter_in_kernel) {
		if ((err = set_kernel_filter(handle, &fcode)) == 0)
		{
			/*
			 * Installation succeded - using kernel filter,
			 * so userland filtering not needed.
			 */
			handlep->filter_in_userland = 0;
		}
		else if (err == -1)	/* Non-fatal error */
		{
			/*
			 * Print a warning if we weren't able to install
			 * the filter for a reason other than "this kernel
			 * isn't configured to support socket filters.
			 */
			if (errno != ENOPROTOOPT && errno != EOPNOTSUPP) {
				fprintf(stderr,
				    "Warning: Kernel filter failed: %s\n",
					pcap_strerror(errno));
			}
		}
	}

	/*
	 * If we're not using the kernel filter, get rid of any kernel
	 * filter that might've been there before, e.g. because the
	 * previous filter could work in the kernel, or because some other
	 * code attached a filter to the socket by some means other than
	 * calling "pcap_setfilter()".  Otherwise, the kernel filter may
	 * filter out packets that would pass the new userland filter.
	 */
	if (handlep->filter_in_userland) {
		if (reset_kernel_filter(handle) == -1) {
			pcap_snprintf(handle->errbuf, PCAP_ERRBUF_SIZE,
			    "can't remove kernel filter: %s",
			    pcap_strerror(errno));
			err = -2;	/* fatal error */
		}
	}

	/*
	 * Free up the copy of the filter that was made by "fix_program()".
	 */
	if (fcode.filter != NULL)
		free(fcode.filter);

	if (err == -2)
		/* Fatal error */
		return -1;
#endif /* SO_ATTACH_FILTER */

	return 0;
}